

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

void __thiscall
GEO::Delaunay2d::add_triangle_to_list(Delaunay2d *this,index_t t,index_t *first,index_t *last)

{
  if (*last == 0x7fffffff) {
    *last = t;
    *first = t;
    (this->cell_next_).super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
    .super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
    super__Vector_impl_data._M_start[t] = 0x7fffffff;
    return;
  }
  (this->cell_next_).super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
  super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
  super__Vector_impl_data._M_start[t] = *first;
  *first = t;
  return;
}

Assistant:

void add_triangle_to_list(index_t t, index_t& first, index_t& last) {
            geo_debug_assert(t < max_t());
            geo_debug_assert(!triangle_is_in_list(t));
            if(last == END_OF_LIST) {
                geo_debug_assert(first == END_OF_LIST);
                first = last = t;
                cell_next_[t] = END_OF_LIST;
            } else {
                cell_next_[t] = first;
                first = t;
            }
        }